

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::testVerticalHeader(Test *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  QFont *pQVar5;
  AutoTableElement *pAVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  AutoTableElement tableElement;
  Report report;
  QFont aQStack_88 [16];
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  Report local_40 [24];
  QByteArrayView local_28;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(local_40,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_40);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  QByteArrayView::QByteArrayView<char,_true>(&local_28,"Noto Sans",9);
  QVar7.m_data = (storage_type *)local_28.m_size;
  QVar7.m_size = (qsizetype)&local_60;
  QString::fromLatin1(QVar7);
  qVar3 = local_78.size;
  pcVar2 = local_78.ptr;
  pDVar1 = local_78.d;
  local_78.d = local_60.d;
  local_60.d = pDVar1;
  local_78.ptr = local_60.ptr;
  local_78.size = local_60.size;
  local_60.ptr = pcVar2;
  local_60.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QFont::QFont(aQStack_88,(QString *)&local_78,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_40);
  QFont::~QFont(aQStack_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  pQVar5 = (QFont *)KDReports::Report::mainTable();
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  QByteArrayView::QByteArrayView<char,_true>(&local_28,"courier",7);
  QVar8.m_data = (storage_type *)local_28.m_size;
  QVar8.m_size = (qsizetype)&local_60;
  QString::fromLatin1(QVar8);
  qVar3 = local_78.size;
  pcVar2 = local_78.ptr;
  pDVar1 = local_78.d;
  local_78.d = local_60.d;
  local_60.d = pDVar1;
  local_78.ptr = local_60.ptr;
  local_78.size = local_60.size;
  local_60.ptr = pcVar2;
  local_60.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QFont::QFont(aQStack_88,(QString *)&local_78,0x1e,-1,false);
  KDReports::MainTable::setVerticalHeaderFont(pQVar5);
  QFont::~QFont(aQStack_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_60,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_60,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar6);
  iVar4 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar4,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1b1);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_60);
  KDReports::Report::~Report(local_40);
  return;
}

Assistant:

void testVerticalHeader()
    {
        // Check that the font for vertical headers is taken into account
        // in the layouting.
        // For that, we make it huge, and we check that the report takes two pages.
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        report.mainTable()->setVerticalHeaderFont(QFont(QLatin1String("courier"), 30));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
    }